

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk88(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk88 *peVar4;
  envy_bios_power_unk88_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk88 *unk88;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk88;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk88.version);
    if ((bios->power).unk88.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk88.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk88.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk88.entriesnum);
      (bios->power).unk88.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk88_entry *)malloc((ulong)(bios->power).unk88.entriesnum << 2);
      (bios->power).unk88.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk88.entriesnum; data = data + 1) {
        (bios->power).unk88.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk88.hlen + data * (bios->power).unk88.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER DI table version 0x%x\n",(ulong)(bios->power).unk88.version
             );
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk88(struct envy_bios *bios) {
	struct envy_bios_power_unk88 *unk88 = &bios->power.unk88;
	int i, err = 0;

	if (!unk88->offset)
		return -EINVAL;

	bios_u8(bios, unk88->offset + 0x0, &unk88->version);
	switch(unk88->version) {
	case 0x10:
		err |= bios_u8(bios, unk88->offset + 0x1, &unk88->hlen);
		err |= bios_u8(bios, unk88->offset + 0x2, &unk88->rlen);
		err |= bios_u8(bios, unk88->offset + 0x3, &unk88->entriesnum);
		unk88->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER DI table version 0x%x\n", unk88->version);
		return -EINVAL;
	};

	err = 0;
	unk88->entries = malloc(unk88->entriesnum * sizeof(struct envy_bios_power_unk88_entry));
	for (i = 0; i < unk88->entriesnum; i++) {
		uint32_t data = unk88->offset + unk88->hlen + i * unk88->rlen;

		unk88->entries[i].offset = data;
	}

	return 0;
}